

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

int birthday_sample(int n,int *seed)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  if (n < 1) {
LAB_00194588:
    uVar4 = 0;
  }
  else {
    piVar3 = i4vec_uniform_ab_new(n,1,0x16d,seed);
    uVar4 = n - 1;
    if (uVar4 != 0) {
      uVar5 = 0;
      iVar6 = 0;
      do {
        iVar2 = iVar6 + 1;
        if (uVar5 != 0) {
          uVar8 = 0;
          do {
            iVar2 = iVar6;
            if (piVar3[uVar5] == piVar3[uVar8]) break;
            uVar8 = uVar8 + 1;
            iVar2 = iVar6 + 1;
          } while (uVar5 != uVar8);
        }
        iVar6 = iVar2;
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar4);
      if (iVar6 < (int)uVar4) goto LAB_00194588;
    }
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar1 = uVar7 + 1;
      if (uVar5 != 0) {
        uVar8 = 0;
        do {
          uVar1 = uVar7;
          if (piVar3[uVar5] == piVar3[uVar8]) break;
          uVar8 = uVar8 + 1;
          uVar1 = uVar7 + 1;
        } while (uVar5 != uVar8);
      }
      uVar7 = uVar1;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n);
    uVar4 = (uint)(uVar7 == uVar4);
    operator_delete__(piVar3);
  }
  return uVar4;
}

Assistant:

int birthday_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_SAMPLE samples the Birthday Concurrence PDF.
//
//  Discussion:
//
//    The probability is the probability that the N-th person is the
//    first one to match a birthday with someone earlier.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int BIRTHDAY_SAMPLE,
//    * 1 if the first N-1 people had distinct
//      birthdays, but person N had a birthday in common with a previous person,
//    * 0 otherwise.
//
{
  int *b;
  int u1;
  int u2;
  int value;

  if ( n < 1 )
  {
    value = 0;
    return value;
  }
//
//  Choose N birthdays at random.
//
  b = i4vec_uniform_ab_new ( n, 1, 365, seed );
//
//  Are the first N-1 birthdays unique?
//
  u1 = i4vec_unique_count ( n - 1, b );

  if ( u1 < n - 1 )
  {
    value = 0;
    return value;
  }
//
//  Does the N-th birthday match an earlier one?
//
  u2 = i4vec_unique_count ( n, b );

  if ( u2 == n - 1 )
  {
    value = 1;
  }
  else
  {
    value = 0;
  }

  delete [] b;

  return value;
}